

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmClr<(moira::Instr)33,(moira::Mode)3,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  Ea<(moira::Mode)3,_4> dst;
  u32 local_14;
  ushort local_10;
  
  local_10 = op & 7;
  local_14 = *addr;
  cVar5 = 'c';
  lVar3 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar5;
    cVar5 = "bclr"[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pcVar4 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar4 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar4 = '.';
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
  }
  *pcVar4 = 'l';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_4> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmClr(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << dst;
}